

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.cc
# Opt level: O2

void __thiscall rcg::Stream::startStreaming(Stream *this,int nacquire,int min_buffers)

{
  element_type *peVar1;
  bool bVar2;
  int iVar3;
  GC_ERROR GVar4;
  undefined4 extraout_var;
  long *plVar5;
  size_t sVar6;
  undefined4 extraout_var_00;
  size_t sVar7;
  undefined4 extraout_var_01;
  ICommand *pIVar8;
  undefined4 extraout_var_02;
  GenTLException *pGVar9;
  ulong uVar10;
  uint64_t uVar11;
  size_t i;
  ulong uVar12;
  IBase *pIVar13;
  shared_ptr<GenApi_3_4::CNodeMapRef> nmap;
  undefined1 local_a0 [16];
  BUFFER_HANDLE pp;
  CCommandPtr start;
  
  std::recursive_mutex::lock(&this->mtx);
  Buffer::setHandle(&this->buffer,(void *)0x0);
  if (this->stream == (void *)0x0) {
    pGVar9 = (GenTLException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string
              ((string *)&pp,"Stream::startStreaming(): Stream is not open",(allocator *)&nmap);
    GenTLException::GenTLException(pGVar9,(string *)&pp);
    __cxa_throw(pGVar9,&GenTLException::typeinfo,GenTLException::~GenTLException);
  }
  if (this->bn != 0) {
    stopStreaming(this);
  }
  Device::getRemoteNodeMap
            ((Device *)&nmap,
             (char *)(this->parent).super___shared_ptr<rcg::Device,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr);
  peVar1 = nmap.super___shared_ptr<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  GenICam_3_4::gcstring::gcstring((gcstring *)&pp,"TLParamsLocked");
  iVar3 = (*(peVar1->super_CNodeMapRefT<GenApi_3_4::CGeneric_XMLLoaderParams>).
            super_CGeneric_XMLLoaderParams._vptr_CGeneric_XMLLoaderParams[7])(peVar1,&pp);
  if (CONCAT44(extraout_var,iVar3) == 0) {
    plVar5 = (long *)0x0;
  }
  else {
    plVar5 = (long *)__dynamic_cast(CONCAT44(extraout_var,iVar3),&GenApi_3_4::INode::typeinfo,
                                    &GenApi_3_4::IInteger::typeinfo,0xfffffffffffffffe);
  }
  GenICam_3_4::gcstring::~gcstring((gcstring *)&pp);
  if (plVar5 == (long *)0x0) {
    pIVar13 = (IBase *)0x0;
  }
  else {
    pIVar13 = (IBase *)(*(long *)(*plVar5 + -0x28) + (long)plVar5);
  }
  bVar2 = GenApi_3_4::IsWritable(pIVar13);
  if (bVar2) {
    (**(code **)(*plVar5 + 0x38))(plVar5,1,1);
  }
  bVar2 = getDefinesPayloadsize(this);
  peVar1 = nmap.super___shared_ptr<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (bVar2) {
    sVar6 = getPayloadSize(this);
  }
  else {
    GenICam_3_4::gcstring::gcstring((gcstring *)&pp,"PayloadSize");
    iVar3 = (*(peVar1->super_CNodeMapRefT<GenApi_3_4::CGeneric_XMLLoaderParams>).
              super_CGeneric_XMLLoaderParams._vptr_CGeneric_XMLLoaderParams[7])(peVar1,&pp);
    if (CONCAT44(extraout_var_00,iVar3) == 0) {
      plVar5 = (long *)0x0;
    }
    else {
      plVar5 = (long *)__dynamic_cast(CONCAT44(extraout_var_00,iVar3),&GenApi_3_4::INode::typeinfo,
                                      &GenApi_3_4::IInteger::typeinfo,0xfffffffffffffffe);
    }
    GenICam_3_4::gcstring::~gcstring((gcstring *)&pp);
    if (plVar5 == (long *)0x0) {
      pIVar13 = (IBase *)0x0;
    }
    else {
      pIVar13 = (IBase *)(*(long *)(*plVar5 + -0x28) + (long)plVar5);
    }
    bVar2 = GenApi_3_4::IsReadable(pIVar13);
    if (bVar2) {
      sVar6 = (**(code **)(*plVar5 + 0x48))(plVar5,0,0);
    }
    else {
      sVar6 = 0;
    }
  }
  sVar7 = getBufAnnounceMin(this);
  uVar10 = (long)min_buffers;
  if ((ulong)(long)min_buffers < sVar7) {
    uVar10 = sVar7;
  }
  this->bn = uVar10;
  for (uVar12 = 0; uVar12 < uVar10; uVar12 = uVar12 + 1) {
    pp = (BUFFER_HANDLE)0x0;
    GVar4 = (*((this->gentl).super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr)->DSAllocAndAnnounceBuffer)(this->stream,sVar6,(void *)0x0,&pp);
    if ((GVar4 != 0) ||
       (GVar4 = (*((this->gentl).
                   super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  DSQueueBuffer)(this->stream,pp), GVar4 != 0)) goto LAB_001102a1;
    uVar10 = this->bn;
  }
  GVar4 = (*((this->gentl).super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->GCRegisterEvent)(this->stream,1,&this->event);
  if (GVar4 == 0) {
    uVar11 = 0xffffffffffffffff;
    if (0 < nacquire) {
      uVar11 = (ulong)(uint)nacquire;
    }
    GVar4 = (*((this->gentl).super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr)->DSStartAcquisition)(this->stream,0,uVar11);
    if (GVar4 == 0) {
      Device::getRemoteNodeMap
                ((Device *)local_a0,
                 (char *)(this->parent).super___shared_ptr<rcg::Device,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr);
      GenICam_3_4::gcstring::gcstring((gcstring *)&pp,"AcquisitionStart");
      iVar3 = (*(*(_func_int ***)local_a0._0_8_)[7])(local_a0._0_8_,&pp);
      plVar5 = (long *)CONCAT44(extraout_var_01,iVar3);
      if (plVar5 == (long *)0x0) {
        pIVar13 = (IBase *)0x0;
      }
      else {
        pIVar13 = (IBase *)((long)plVar5 + *(long *)(*plVar5 + -0x28));
      }
      GenApi_3_4::CPointer<GenApi_3_4::ICommand,_GenApi_3_4::IBase>::CPointer(&start,pIVar13);
      GenICam_3_4::gcstring::~gcstring((gcstring *)&pp);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_a0 + 8));
      pIVar8 = GenApi_3_4::CPointer<GenApi_3_4::ICommand,_GenApi_3_4::IBase>::operator->(&start);
      (**(code **)(*(long *)pIVar8 + 0x38))(pIVar8,1);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&nmap.super___shared_ptr<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      pthread_mutex_unlock((pthread_mutex_t *)&this->mtx);
      return;
    }
    (*((this->gentl).super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
      ->GCUnregisterEvent)(this->stream,1);
  }
LAB_001102a1:
  (*((this->gentl).super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    DSFlushQueue)(this->stream,4);
  start._vptr_CPointer = (_func_int **)0x0;
  while (GVar4 = (*((this->gentl).
                    super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                   ->DSGetBufferID)(this->stream,0,&start._vptr_CPointer), GVar4 == 0) {
    (*((this->gentl).super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
      ->DSRevokeBuffer)(this->stream,start._vptr_CPointer,(void **)0x0,(void **)0x0);
  }
  GenICam_3_4::gcstring::gcstring((gcstring *)&pp,"TLParamsLocked");
  iVar3 = (*((nmap.super___shared_ptr<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            super_CNodeMapRefT<GenApi_3_4::CGeneric_XMLLoaderParams>).super_CGeneric_XMLLoaderParams
            ._vptr_CGeneric_XMLLoaderParams[7])
                    (nmap.super___shared_ptr<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr,&pp);
  if (CONCAT44(extraout_var_02,iVar3) == 0) {
    plVar5 = (long *)0x0;
  }
  else {
    plVar5 = (long *)__dynamic_cast(CONCAT44(extraout_var_02,iVar3),&GenApi_3_4::INode::typeinfo,
                                    &GenApi_3_4::IInteger::typeinfo,0xfffffffffffffffe);
  }
  GenICam_3_4::gcstring::~gcstring((gcstring *)&pp);
  if (plVar5 == (long *)0x0) {
    pIVar13 = (IBase *)0x0;
  }
  else {
    pIVar13 = (IBase *)(*(long *)(*plVar5 + -0x28) + (long)plVar5);
  }
  bVar2 = GenApi_3_4::IsWritable(pIVar13);
  if (bVar2) {
    (**(code **)(*plVar5 + 0x38))(plVar5,0,1);
  }
  pGVar9 = (GenTLException *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string((string *)&pp,"Stream::startStreaming()",(allocator *)local_a0);
  GenTLException::GenTLException(pGVar9,(string *)&pp,&this->gentl);
  __cxa_throw(pGVar9,&GenTLException::typeinfo,GenTLException::~GenTLException);
}

Assistant:

void Stream::startStreaming(int nacquire, int min_buffers)
{
  std::lock_guard<std::recursive_mutex> lock(mtx);

  buffer.setHandle(0);

  if (stream == 0)
  {
    throw GenTLException("Stream::startStreaming(): Stream is not open");
  }

  // stop streaming if it is currently running

  if (bn > 0)
  {
    stopStreaming();
  }

  // lock parameters before streaming starts

  std::shared_ptr<GenApi::CNodeMapRef> nmap=parent->getRemoteNodeMap();
  GenApi::IInteger *p=dynamic_cast<GenApi::IInteger *>(nmap->_GetNode("TLParamsLocked"));

  if (GenApi::IsWritable(p))
  {
    p->SetValue(1);
  }

  // determine maximum buffer size from transport layer or remote device

  size_t size=0;
  if (getDefinesPayloadsize())
  {
    size=getPayloadSize();
  }
  else
  {
    GenApi::IInteger *pp=dynamic_cast<GenApi::IInteger *>(nmap->_GetNode("PayloadSize"));

    if (GenApi::IsReadable(pp))
    {
      size=static_cast<size_t>(pp->GetValue());
    }
  }

  // announce and queue the minimum number of buffers

  bool err=false;

  bn=std::max(static_cast<size_t>(min_buffers), getBufAnnounceMin());
  for (size_t i=0; i<bn; i++)
  {
    GenTL::BUFFER_HANDLE pp=0;

    if (gentl->DSAllocAndAnnounceBuffer(stream, size, 0, &pp) != GenTL::GC_ERR_SUCCESS)
    {
      err=true;
      break;
    }

    if (!err && gentl->DSQueueBuffer(stream, pp) != GenTL::GC_ERR_SUCCESS)
    {
      err=true;
      break;
    }
  }

  // register event

  if (!err && gentl->GCRegisterEvent(stream, GenTL::EVENT_NEW_BUFFER, &event) !=
      GenTL::GC_ERR_SUCCESS)
  {
    err=true;
  }

  // start streaming

  uint64_t n=GENTL_INFINITE;

  if (nacquire > 0)
  {
    n=static_cast<uint64_t>(nacquire);
  }

  if (!err && gentl->DSStartAcquisition(stream, GenTL::ACQ_START_FLAGS_DEFAULT, n) !=
      GenTL::GC_ERR_SUCCESS)
  {
    gentl->GCUnregisterEvent(stream, GenTL::EVENT_NEW_BUFFER);
    err=true;
  }

  if (!err)
  {
    GenApi::CCommandPtr start=parent->getRemoteNodeMap()->_GetNode("AcquisitionStart");
    start->Execute();
  }

  // revoke buffers in case of an error, before throwing an event

  if (err)
  {
    gentl->DSFlushQueue(stream, GenTL::ACQ_QUEUE_ALL_DISCARD);

    GenTL::BUFFER_HANDLE pp=0;
    while (gentl->DSGetBufferID(stream, 0, &pp) == GenTL::GC_ERR_SUCCESS)
    {
      gentl->DSRevokeBuffer(stream, pp, 0, 0);
    }

    // unlock parameters

    GenApi::IInteger *pi=dynamic_cast<GenApi::IInteger *>(nmap->_GetNode("TLParamsLocked"));

    if (GenApi::IsWritable(pi))
    {
      pi->SetValue(0);
    }

    throw GenTLException("Stream::startStreaming()", gentl);
  }
}